

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O1

void bonk_tilde_setup(void)

{
  undefined8 in_RAX;
  uint uVar3;
  t_symbol *ptVar1;
  _class *p_Var2;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("bonk~");
  p_Var2 = class_new(ptVar1,bonk_new,bonk_free,0x2668,0,A_GIMME,(ulong)uVar3 << 0x20);
  bonk_class = p_Var2;
  ptVar1 = gensym("signal");
  class_addmethod(p_Var2,nullfn,ptVar1,A_NULL);
  p_Var2 = bonk_class;
  ptVar1 = gensym("dsp");
  class_addmethod(p_Var2,bonk_dsp,ptVar1,A_CANT,0);
  class_addbang(bonk_class,bonk_bang);
  p_Var2 = bonk_class;
  ptVar1 = gensym("learn");
  class_addmethod(p_Var2,bonk_learn,ptVar1,A_FLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("forget");
  class_addmethod(p_Var2,bonk_forget,ptVar1,A_NULL);
  p_Var2 = bonk_class;
  ptVar1 = gensym("thresh");
  class_addmethod(p_Var2,bonk_thresh,ptVar1,A_FLOAT,1,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("mask");
  class_addmethod(p_Var2,bonk_mask,ptVar1,A_FLOAT,1,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("debounce");
  class_addmethod(p_Var2,bonk_debounce,ptVar1,A_FLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("minvel");
  class_addmethod(p_Var2,bonk_minvel,ptVar1,A_FLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("print");
  class_addmethod(p_Var2,bonk_print,ptVar1,A_DEFFLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("debug");
  class_addmethod(p_Var2,bonk_debug,ptVar1,A_DEFFLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("spew");
  class_addmethod(p_Var2,bonk_spew,ptVar1,A_DEFFLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("useloudness");
  class_addmethod(p_Var2,bonk_useloudness,ptVar1,A_DEFFLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("attack-bins");
  class_addmethod(p_Var2,bonk_attackbins,ptVar1,A_DEFFLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("attack-frames");
  class_addmethod(p_Var2,bonk_attackbins,ptVar1,A_DEFFLOAT,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("read");
  class_addmethod(p_Var2,bonk_read,ptVar1,A_SYMBOL,0);
  p_Var2 = bonk_class;
  ptVar1 = gensym("write");
  class_addmethod(p_Var2,bonk_write,ptVar1,A_SYMBOL,0);
  post("bonk version 1.5");
  return;
}

Assistant:

void bonk_tilde_setup(void)
{
    bonk_class = class_new(gensym("bonk~"), (t_newmethod)bonk_new,
        (t_method)bonk_free, sizeof(t_bonk), 0, A_GIMME, 0);
    class_addmethod(bonk_class, nullfn, gensym("signal"), 0);
    class_addmethod(bonk_class, (t_method)bonk_dsp, gensym("dsp"), A_CANT, 0);
    class_addbang(bonk_class, bonk_bang);
    class_addmethod(bonk_class, (t_method)bonk_learn,
        gensym("learn"), A_FLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_forget, gensym("forget"), 0);
    class_addmethod(bonk_class, (t_method)bonk_thresh,
        gensym("thresh"), A_FLOAT, A_FLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_mask,
        gensym("mask"), A_FLOAT, A_FLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_debounce,
        gensym("debounce"), A_FLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_minvel,
        gensym("minvel"), A_FLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_print,
        gensym("print"), A_DEFFLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_debug,
        gensym("debug"), A_DEFFLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_spew,
        gensym("spew"), A_DEFFLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_useloudness,
        gensym("useloudness"), A_DEFFLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_attackbins,
        gensym("attack-bins"), A_DEFFLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_attackbins,
        gensym("attack-frames"), A_DEFFLOAT, 0);
    class_addmethod(bonk_class, (t_method)bonk_read,
        gensym("read"), A_SYMBOL, 0);
    class_addmethod(bonk_class, (t_method)bonk_write,
        gensym("write"), A_SYMBOL, 0);
    post("bonk version 1.5");
}